

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O3

int ctemplate_htmlparser::htmlparser_is_js_quoted(htmlparser_ctx *ctx)

{
  int iVar1;
  
  iVar1 = htmlparser_in_js(ctx);
  if ((iVar1 != 0) && (iVar1 = jsparser_state(ctx->jsparser), 0xfffffffd < iVar1 - 3U)) {
    return 1;
  }
  return 0;
}

Assistant:

int htmlparser_is_js_quoted(htmlparser_ctx *ctx)
{
    if (htmlparser_in_js(ctx)) {
      int st = jsparser_state(ctx->jsparser);
      if (st == JSPARSER_STATE_Q ||
          st == JSPARSER_STATE_DQ)
        return 1;
    }
    return 0;
}